

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_sink_test.cc
# Opt level: O2

void __thiscall
google::protobuf::io::zc_sink_internal::anon_unknown_0::ZeroCopyStreamByteSinkTest_WriteLong_Test::
TestBody(ZeroCopyStreamByteSinkTest_WriteLong_Test *this)

{
  ChunkedString *this_00;
  bool bVar1;
  char *message;
  string_view sVar2;
  ScopedTrace gtest_trace_180;
  ScopedTrace gtest_trace_188;
  ScopedTrace gtest_trace_184;
  ChunkedString input;
  ZeroCopyStreamByteSink byte_sink;
  string local_b0;
  AssertionResult gtest_ar;
  
  this_00 = &(this->super_ZeroCopyStreamByteSinkTest).output_chunks_;
  while( true ) {
    zc_sink_internal::(anonymous_namespace)::ChunkedString::PatternAsQuotedString_abi_cxx11_
              ((string *)&gtest_ar,this_00);
    testing::ScopedTrace::ScopedTrace
              (&gtest_trace_180,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
               ,0xb4,(string *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    input.data_._M_len = 0xb;
    input.data_._M_str = "0123456789A";
    input.skipped_patterns_ = 1;
    input.pattern_ = 0;
    do {
      input.pattern_bit_idx_ = 0;
      zc_sink_internal::(anonymous_namespace)::ChunkedString::PatternAsQuotedString_abi_cxx11_
                ((string *)&gtest_ar,&input);
      testing::ScopedTrace::ScopedTrace
                (&gtest_trace_184,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
                 ,0xb8,(string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[8] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[9] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[0] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[1] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[2] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[3] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[4] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[5] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[6] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[7] = '\0';
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(this_00->data_)._M_len;
      gtest_ar._0_8_ = &PTR__PatternedOutputStream_01668750;
      byte_sink.bytes_written_._0_1_ = 0;
      byte_sink._25_8_ = 0;
      byte_sink.buffer_ = (void *)0x0;
      byte_sink.buffer_size_._0_1_ = 0;
      byte_sink.buffer_size_._1_7_ = 0;
      byte_sink.stream_ = (ZeroCopyOutputStream *)&gtest_ar;
      zc_sink_internal::(anonymous_namespace)::ChunkedString::PatternAsQuotedString_abi_cxx11_
                (&local_b0,&input);
      testing::ScopedTrace::ScopedTrace
                (&gtest_trace_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
                 ,0xbc,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      while( true ) {
        sVar2 = ChunkedString::NextChunk(&input);
        if (sVar2._M_len == 0) break;
        ZeroCopyStreamByteSink::Append(&byte_sink,sVar2._M_str,sVar2._M_len);
      }
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_188);
      ZeroCopyStreamByteSink::~ZeroCopyStreamByteSink(&byte_sink);
      PatternedOutputStream::~PatternedOutputStream((PatternedOutputStream *)&gtest_ar);
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_184);
      input.pattern_ = input.pattern_ + input.skipped_patterns_;
    } while (input.pattern_ < (ulong)(long)(1 << ((byte)input.data_._M_len & 0x1f)));
    testing::internal::CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,char[11]>
              ((internal *)&gtest_ar,"output_view_","\"0123456789\"",
               &(this->super_ZeroCopyStreamByteSinkTest).output_view_,(char (*) [11])0xd683f8);
    if (gtest_ar.success_ == false) break;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_180);
    bVar1 = ChunkedString::NextPattern(this_00);
    if (!bVar1) {
      return;
    }
  }
  testing::Message::Message((Message *)&byte_sink);
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl ==
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    message = anon_var_dwarf_651463 + 5;
  }
  else {
    message = *(char **)gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_b0,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
             ,0xc3,message);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&byte_sink);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
  if (byte_sink.stream_ != (ZeroCopyOutputStream *)0x0) {
    (*(byte_sink.stream_)->_vptr_ZeroCopyOutputStream[1])();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_180);
  return;
}

Assistant:

TEST_F(ZeroCopyStreamByteSinkTest, WriteLong) {
  do {
    SCOPED_TRACE(output_chunks_.PatternAsQuotedString());
    ChunkedString input("0123456789A", 1);

    do {
      SCOPED_TRACE(input.PatternAsQuotedString());
      output_ = {};
      PatternedOutputStream output_stream(output_chunks_);
      ZeroCopyStreamByteSink byte_sink(&output_stream);
      SCOPED_TRACE(input.PatternAsQuotedString());
      absl::string_view chunk;
      while (!(chunk = input.NextChunk()).empty()) {
        byte_sink.Append(chunk.data(), chunk.size());
      }
    } while (input.NextPattern());

    ASSERT_EQ(output_view_, "0123456789");
  } while (output_chunks_.NextPattern());
}